

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O1

void FileUtil::readMetaData
               (string *data_folder,int *user_num,int *item_num,int *train_rating_num,
               int *test_rating_num,string *train_path,string *test_path)

{
  pointer pcVar1;
  char cVar2;
  ulonglong uVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string line;
  string meta_path;
  ifstream data_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  iterator_range<const_char_*> local_2e8;
  long local_2d8;
  long lStack_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  char *local_2a8;
  long local_2a0;
  char local_298 [16];
  int *local_288;
  anon_union_16_2_ba345be5_for_m_Storage local_280;
  ulong local_270;
  anon_union_16_2_ba345be5_for_m_Storage local_268;
  ulong local_258;
  anon_union_16_2_ba345be5_for_m_Storage local_250;
  ulong local_240;
  long local_238 [4];
  int aiStack_218 [122];
  
  local_2a8 = local_298;
  pcVar1 = (data_folder->_M_dataplus)._M_p;
  local_288 = test_rating_num;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,pcVar1,pcVar1 + data_folder->_M_string_length);
  std::__cxx11::string::append((char *)&local_2a8);
  std::ifstream::ifstream(local_238,local_2a8,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    local_2c8._M_string_length = 0;
    local_2c8.field_2._M_local_buf[0] = '\0';
    cVar2 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_2c8,cVar2);
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2e8.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
    .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
         " ";
    local_2e8.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
    .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
         "";
    boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
              ((is_any_ofF<char> *)&local_250,&local_2e8);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&local_328,&local_2c8,(is_any_ofF<char> *)&local_250,token_compress_off);
    if ((0x10 < local_240) && (local_250.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_250.m_dynSet);
    }
    uVar3 = strtoull(((local_328.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,(char **)0x0,0)
    ;
    *user_num = (int)uVar3;
    uVar3 = strtoull(local_328.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,(char **)0x0,0);
    *item_num = (int)uVar3;
    cVar2 = std::ios::widen((char)(istream *)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18)
                           );
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_2c8,cVar2);
    local_2e8.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
    .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
         " ";
    local_2e8.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
    .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
         "";
    boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
              ((is_any_ofF<char> *)&local_268,&local_2e8);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&local_328,&local_2c8,(is_any_ofF<char> *)&local_268,token_compress_off);
    if ((0x10 < local_258) && (local_268.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_268.m_dynSet);
    }
    uVar3 = strtoull(((local_328.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,(char **)0x0,0)
    ;
    *train_rating_num = (int)uVar3;
    pcVar1 = (data_folder->_M_dataplus)._M_p;
    local_308[0] = local_2f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,pcVar1,pcVar1 + data_folder->_M_string_length);
    std::__cxx11::string::append((char *)local_308);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_308,
                                (ulong)local_328.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                               );
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_2d8 = *plVar6;
      lStack_2d0 = plVar4[3];
      local_2e8.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = (char *)&local_2d8;
    }
    else {
      local_2d8 = *plVar6;
      local_2e8.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = (char *)*plVar4;
    }
    local_2e8.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
    .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
         (char *)plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)train_path,(string *)&local_2e8);
    if ((long *)local_2e8.
                super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
                .
                super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>
                .
                super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>
                .m_Begin != &local_2d8) {
      operator_delete(local_2e8.
                      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
                      .
                      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>
                      .
                      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>
                      .m_Begin);
    }
    if (local_308[0] != local_2f8) {
      operator_delete(local_308[0]);
    }
    cVar2 = std::ios::widen((char)(istream *)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18)
                           );
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_2c8,cVar2);
    local_2e8.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
    .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
         " ";
    local_2e8.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
    .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
         "";
    boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
              ((is_any_ofF<char> *)&local_280,&local_2e8);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&local_328,&local_2c8,(is_any_ofF<char> *)&local_280,token_compress_off);
    if ((0x10 < local_270) && (local_280.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_280.m_dynSet);
    }
    uVar3 = strtoull(((local_328.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,(char **)0x0,0)
    ;
    *local_288 = (int)uVar3;
    pcVar1 = (data_folder->_M_dataplus)._M_p;
    local_308[0] = local_2f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,pcVar1,pcVar1 + data_folder->_M_string_length);
    std::__cxx11::string::append((char *)local_308);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_308,
                                (ulong)local_328.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                               );
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_2d8 = *plVar6;
      lStack_2d0 = plVar4[3];
      local_2e8.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = (char *)&local_2d8;
    }
    else {
      local_2d8 = *plVar6;
      local_2e8.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = (char *)*plVar4;
    }
    local_2e8.super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
    .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
         (char *)plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)test_path,(string *)&local_2e8);
    if ((long *)local_2e8.
                super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
                .
                super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>
                .
                super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>
                .m_Begin != &local_2d8) {
      operator_delete(local_2e8.
                      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>
                      .
                      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>
                      .
                      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>
                      .m_Begin);
    }
    if (local_308[0] != local_2f8) {
      operator_delete(local_308[0]);
    }
    std::ifstream::close();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_238);
    if (local_2a8 != local_298) {
      operator_delete(local_2a8);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"cannot open ",0xc);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_2a8,local_2a0);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

void readMetaData(string data_folder, int &user_num, int &item_num, int &train_rating_num,
                      int &test_rating_num, string &train_path, string &test_path) {

        string meta_path = data_folder + "/meta";

        ifstream data_file(meta_path.c_str());

        if(!data_file.good()){
            cerr << "cannot open " << meta_path << endl;
            exit(1);
        }

        string line;
        std::getline(data_file, line);
        vector<string> par;
        boost::split(par, line, boost::is_any_of(" "));

        user_num = strtoull(par[0].c_str(), nullptr, 0);
        item_num = strtoull(par[1].c_str(), nullptr, 0);

        std::getline(data_file, line);
        boost::split(par, line, boost::is_any_of(" "));
        train_rating_num = strtoull(par[0].c_str(), nullptr, 0);
        train_path = data_folder + "/" + par[1];

        std::getline(data_file, line);
        boost::split(par, line, boost::is_any_of(" "));
        test_rating_num = strtoull(par[0].c_str(), nullptr, 0);
        test_path = data_folder + "/" + par[1];

        data_file.close();
    }